

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::SharedCtor(NetworkUpdateParameters *this)

{
  NetworkUpdateParameters *this_local;
  
  memset(&this->optimizer_,0,0x20);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void NetworkUpdateParameters::SharedCtor() {
  ::memset(&optimizer_, 0, reinterpret_cast<char*>(&seed_) -
    reinterpret_cast<char*>(&optimizer_) + sizeof(seed_));
  _cached_size_ = 0;
}